

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

void av1_init_tpl_stats(TplParams *tpl_data)

{
  undefined1 auVar1 [16];
  long lVar2;
  TplDepStats **ppTVar3;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar23;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar5;
  
  tpl_data->ready = 0;
  tpl_data->tpl_stats_block_mis_log2 = '\x02';
  auVar1 = _DAT_004ca2a0;
  tpl_data->tpl_bsize_1d = '\x10';
  lVar2 = 0x5a8;
  auVar4 = _DAT_004cdc90;
  auVar6 = _DAT_004cdca0;
  auVar7 = _DAT_004cdcb0;
  auVar8 = _DAT_004cdcc0;
  auVar9 = _DAT_004cbe60;
  auVar10 = _DAT_004cbe70;
  auVar11 = _DAT_004ca280;
  auVar12 = _DAT_004ca290;
  do {
    auVar14 = auVar12 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar24._4_4_ = iVar13;
    auVar24._0_4_ = iVar13;
    auVar24._8_4_ = iVar23;
    auVar24._12_4_ = iVar23;
    auVar32._0_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar32._4_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar32._8_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar32._12_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar15._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar15._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar15._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar15._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar15 = auVar15 & auVar32;
    auVar14 = pshuflw(auVar24,auVar15,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x5a0) = 0;
    }
    auVar14 = packssdw(auVar15,auVar15);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 8 & 1) != 0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x540) = 0;
    }
    auVar14 = auVar11 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar25._4_4_ = iVar13;
    auVar25._0_4_ = iVar13;
    auVar25._8_4_ = iVar23;
    auVar25._12_4_ = iVar23;
    auVar33._0_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar33._4_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar33._8_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar33._12_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar16._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16 = auVar16 & auVar33;
    auVar14 = packssdw(auVar25,auVar16);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x10 & 1) != 0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x4e0) = 0;
    }
    auVar14 = pshufhw(auVar16,auVar16,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._0_4_ >> 0x18 & 1) != 0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x480) = 0;
    }
    auVar14 = auVar10 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar26._4_4_ = iVar13;
    auVar26._0_4_ = iVar13;
    auVar26._8_4_ = iVar23;
    auVar26._12_4_ = iVar23;
    auVar34._0_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar34._4_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar34._8_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar34._12_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar17._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar34;
    auVar14 = pshuflw(auVar26,auVar17,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x420) = 0;
    }
    auVar14 = packssdw(auVar17,auVar17);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._4_2_ >> 8 & 1) != 0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x3c0) = 0;
    }
    auVar14 = auVar9 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar27._4_4_ = iVar13;
    auVar27._0_4_ = iVar13;
    auVar27._8_4_ = iVar23;
    auVar27._12_4_ = iVar23;
    auVar35._0_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar35._4_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar35._8_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar35._12_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar18._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar35;
    auVar14 = packssdw(auVar27,auVar18);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x360) = 0;
    }
    auVar14 = pshufhw(auVar18,auVar18,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._6_2_ >> 8 & 1) != 0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x300) = 0;
    }
    auVar14 = auVar8 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar28._4_4_ = iVar13;
    auVar28._0_4_ = iVar13;
    auVar28._8_4_ = iVar23;
    auVar28._12_4_ = iVar23;
    auVar36._0_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar36._4_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar36._8_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar36._12_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar19._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar36;
    auVar14 = pshuflw(auVar28,auVar19,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x2a0) = 0;
    }
    auVar14 = packssdw(auVar19,auVar19);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._8_2_ >> 8 & 1) != 0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x240) = 0;
    }
    auVar14 = auVar7 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar29._4_4_ = iVar13;
    auVar29._0_4_ = iVar13;
    auVar29._8_4_ = iVar23;
    auVar29._12_4_ = iVar23;
    auVar37._0_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar37._4_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar37._8_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar37._12_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar20._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar37;
    auVar14 = packssdw(auVar29,auVar20);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x1e0) = 0;
    }
    auVar14 = pshufhw(auVar20,auVar20,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._10_2_ >> 8 & 1) != 0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x180) = 0;
    }
    auVar14 = auVar6 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar30._4_4_ = iVar13;
    auVar30._0_4_ = iVar13;
    auVar30._8_4_ = iVar23;
    auVar30._12_4_ = iVar23;
    auVar38._0_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar38._4_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar38._8_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar38._12_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar21._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar38;
    auVar14 = pshuflw(auVar30,auVar21,0xe8);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0x120) = 0;
    }
    auVar14 = packssdw(auVar21,auVar21);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._12_2_ >> 8 & 1) != 0) {
      *(undefined1 *)((long)tpl_data + lVar2 + -0xc0) = 0;
    }
    auVar14 = auVar4 ^ auVar1;
    iVar13 = auVar14._0_4_;
    iVar23 = auVar14._8_4_;
    auVar31._4_4_ = iVar13;
    auVar31._0_4_ = iVar13;
    auVar31._8_4_ = iVar23;
    auVar31._12_4_ = iVar23;
    auVar39._0_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar39._4_4_ = -(uint)(iVar13 < -0x7fffff97);
    auVar39._8_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar39._12_4_ = -(uint)(iVar23 < -0x7fffff97);
    auVar22._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar39;
    auVar14 = packssdw(auVar31,auVar22);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(undefined1 *)((long)tpl_data->tpl_stats_buffer + lVar2 + -0x68) = 0;
    }
    auVar14 = pshufhw(auVar22,auVar22,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._14_2_ >> 8 & 1) != 0) {
      *(undefined1 *)((long)tpl_data->tpl_stats_buffer[0].ref_map_index + lVar2 + -0x28) = 0;
    }
    lVar5 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 0x10;
    auVar12._8_8_ = lVar5 + 0x10;
    lVar5 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 0x10;
    auVar11._8_8_ = lVar5 + 0x10;
    lVar5 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 0x10;
    auVar10._8_8_ = lVar5 + 0x10;
    lVar5 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 0x10;
    auVar9._8_8_ = lVar5 + 0x10;
    lVar5 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 0x10;
    auVar8._8_8_ = lVar5 + 0x10;
    lVar5 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 0x10;
    auVar7._8_8_ = lVar5 + 0x10;
    lVar5 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 0x10;
    auVar6._8_8_ = lVar5 + 0x10;
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 0x10;
    auVar4._8_8_ = lVar5 + 0x10;
    lVar2 = lVar2 + 0x600;
  } while (lVar2 != 0x2fa8);
  ppTVar3 = tpl_data->tpl_stats_pool;
  lVar2 = 10;
  do {
    if (*ppTVar3 != (TplDepStats *)0x0) {
      memset(*ppTVar3,0,
             (long)tpl_data->tpl_stats_buffer[0].ref_map_index[lVar2 * 2 + -0xb] *
             (long)tpl_data->tpl_stats_buffer[0].ref_map_index[lVar2 * 2 + -10] * 200);
    }
    ppTVar3 = ppTVar3 + 1;
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x24a);
  return;
}

Assistant:

void av1_init_tpl_stats(TplParams *const tpl_data) {
  tpl_data->ready = 0;
  set_tpl_stats_block_size(&tpl_data->tpl_stats_block_mis_log2,
                           &tpl_data->tpl_bsize_1d);
  for (int frame_idx = 0; frame_idx < MAX_LENGTH_TPL_FRAME_STATS; ++frame_idx) {
    TplDepFrame *tpl_frame = &tpl_data->tpl_stats_buffer[frame_idx];
    tpl_frame->is_valid = 0;
  }
  for (int frame_idx = 0; frame_idx < MAX_LAG_BUFFERS; ++frame_idx) {
    TplDepFrame *tpl_frame = &tpl_data->tpl_stats_buffer[frame_idx];
    if (tpl_data->tpl_stats_pool[frame_idx] == NULL) continue;
    memset(tpl_data->tpl_stats_pool[frame_idx], 0,
           tpl_frame->height * tpl_frame->width *
               sizeof(*tpl_frame->tpl_stats_ptr));
  }
}